

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  ulong uVar1;
  ZSTD_DDict **ptr;
  ZSTD_DDict *ddict_00;
  ZSTD_customMem ZVar2;
  ZSTD_DDictHashSet *hashSet;
  ZSTD_DDict **ppZVar3;
  size_t sVar4;
  size_t sVar5;
  ZSTD_DDictHashSet *pZVar6;
  size_t sVar7;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->dictUses = ZSTD_dont_use;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  if (ddict != (ZSTD_DDict *)0x0) {
    dctx->ddict = ddict;
    dctx->dictUses = ZSTD_use_indefinitely;
    if (dctx->refMultipleDDicts != ZSTD_rmd_refMultipleDDicts) {
      return 0;
    }
    hashSet = dctx->ddictSet;
    if (hashSet == (ZSTD_DDictHashSet *)0x0) {
      ZVar2 = dctx->customMem;
      hashSet = (ZSTD_DDictHashSet *)ZSTD_customMalloc(0x18,dctx->customMem);
      ppZVar3 = (ZSTD_DDict **)ZSTD_customCalloc(0x200,ZVar2);
      hashSet->ddictPtrTable = ppZVar3;
      hashSet->ddictPtrTableSize = 0x40;
      hashSet->ddictPtrCount = 0;
      pZVar6 = hashSet;
      if (ppZVar3 == (ZSTD_DDict **)0x0) {
        pZVar6 = (ZSTD_DDictHashSet *)0x0;
      }
      dctx->ddictSet = pZVar6;
      if (ppZVar3 == (ZSTD_DDict **)0x0) {
        return 0xffffffffffffffc0;
      }
    }
    uVar1 = hashSet->ddictPtrTableSize;
    if (uVar1 <= hashSet->ddictPtrCount << 2) {
      ZVar2 = dctx->customMem;
      ppZVar3 = (ZSTD_DDict **)ZSTD_customCalloc(uVar1 << 4,dctx->customMem);
      if (ppZVar3 == (ZSTD_DDict **)0x0) {
        return 0xffffffffffffffc0;
      }
      ptr = hashSet->ddictPtrTable;
      sVar5 = hashSet->ddictPtrTableSize;
      hashSet->ddictPtrTable = ppZVar3;
      hashSet->ddictPtrTableSize = uVar1 * 2;
      hashSet->ddictPtrCount = 0;
      if (sVar5 != 0) {
        sVar7 = 0;
        do {
          ddict_00 = ptr[sVar7];
          if ((ddict_00 != (ZSTD_DDict *)0x0) &&
             (sVar4 = ZSTD_DDictHashSet_emplaceDDict(hashSet,ddict_00), 0xffffffffffffff88 < sVar4))
          {
            return 0xffffffffffffffff;
          }
          sVar7 = sVar7 + 1;
        } while (sVar5 != sVar7);
      }
      ZSTD_customFree(ptr,ZVar2);
    }
    sVar5 = ZSTD_DDictHashSet_emplaceDDict(hashSet,ddict);
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
  }
  return 0;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
        if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
            if (dctx->ddictSet == NULL) {
                dctx->ddictSet = ZSTD_createDDictHashSet(dctx->customMem);
                if (!dctx->ddictSet) {
                    RETURN_ERROR(memory_allocation, "Failed to allocate memory for hash set!");
                }
            }
            assert(!dctx->staticSize);  /* Impossible: ddictSet cannot have been allocated if static dctx */
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_addDDict(dctx->ddictSet, ddict, dctx->customMem), "");
        }
    }
    return 0;
}